

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

void tcu::fillWithRGBAQuads(PixelBufferAccess *dst)

{
  IVec3 *pitch;
  InternalError *this;
  float fVar1;
  float fVar2;
  Vec4 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  PixelBufferAccess local_58;
  
  if ((dst->super_ConstPixelBufferAccess).m_size.m_data[2] == 1) {
    local_98.m_data[2] = 1.4013e-45;
    pitch = &(dst->super_ConstPixelBufferAccess).m_pitch;
    local_88 = *(undefined8 *)(dst->super_ConstPixelBufferAccess).m_size.m_data;
    uStack_80 = 0;
    fVar1 = (float)((int)local_88 / 2);
    fVar2 = (float)((int)((ulong)local_88 >> 0x20) / 2);
    uStack_70 = 0;
    local_98.m_data[1] = fVar2;
    local_98.m_data[0] = fVar1;
    local_68 = fVar2;
    fStack_64 = fVar2;
    fStack_60 = fVar2;
    fStack_5c = fVar2;
    local_78 = fVar1;
    fStack_74 = fVar2;
    PixelBufferAccess::PixelBufferAccess
              (&local_58,(TextureFormat *)dst,(IVec3 *)&local_98,pitch,
               (dst->super_ConstPixelBufferAccess).m_data);
    local_98.m_data[0] = 1.0;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 1.0;
    clear(&local_58,&local_98);
    local_88._0_4_ = (float)((int)(float)local_88 - (int)local_78);
    local_88._4_4_ = (float)((int)local_88._4_4_ - (int)fStack_74);
    uStack_80 = CONCAT44(uStack_80._4_4_ - uStack_70._4_4_,(int)uStack_80 - (int)uStack_70);
    local_98.m_data[1] = local_68;
    local_98.m_data[0] = (float)local_88;
    local_98.m_data[2] = 1.4013e-45;
    PixelBufferAccess::PixelBufferAccess
              (&local_58,(TextureFormat *)dst,(IVec3 *)&local_98,pitch,
               (void *)((long)((dst->super_ConstPixelBufferAccess).m_pitch.m_data[0] * (int)fVar1) +
                       (long)(dst->super_ConstPixelBufferAccess).m_data));
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 1.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 1.0;
    clear(&local_58,&local_98);
    local_98.m_data[1] = local_88._4_4_;
    local_98.m_data[0] = local_78;
    local_98.m_data[2] = 1.4013e-45;
    PixelBufferAccess::PixelBufferAccess
              (&local_58,(TextureFormat *)dst,(IVec3 *)&local_98,pitch,
               (void *)((long)((dst->super_ConstPixelBufferAccess).m_pitch.m_data[1] * (int)fVar2) +
                       (long)(dst->super_ConstPixelBufferAccess).m_data));
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 1.0;
    local_98.m_data[3] = 0.0;
    clear(&local_58,&local_98);
    local_98.m_data[0] = (float)local_88;
    local_98.m_data[1] = local_88._4_4_;
    local_98.m_data[2] = 1.4013e-45;
    PixelBufferAccess::PixelBufferAccess
              (&local_58,(TextureFormat *)dst,(IVec3 *)&local_98,pitch,
               (void *)((long)(dst->super_ConstPixelBufferAccess).m_data +
                       (long)((int)fVar2 * (dst->super_ConstPixelBufferAccess).m_pitch.m_data[1]) +
                       (long)((int)fVar1 * (dst->super_ConstPixelBufferAccess).m_pitch.m_data[0])));
    local_98.m_data._0_8_ = &DAT_3f0000003f000000;
    local_98.m_data[2] = 0.5;
    local_98.m_data[3] = 1.0;
    clear(&local_58,&local_98);
    return;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this,(char *)0x0,"dst.getDepth() == 1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuTextureUtil.cpp"
             ,0x3c8);
  __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

void fillWithRGBAQuads (const PixelBufferAccess& dst)
{
	TCU_CHECK_INTERNAL(dst.getDepth() == 1);
	int width	= dst.getWidth();
	int height	= dst.getHeight();
	int	left	= width/2;
	int top		= height/2;

	clear(getSubregion(dst, 0,		0,		0, left,		top,		1),	Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	clear(getSubregion(dst, left,	0,		0, width-left,	top,		1),	Vec4(0.0f, 1.0f, 0.0f, 1.0f));
	clear(getSubregion(dst, 0,		top,	0, left,		height-top,	1), Vec4(0.0f, 0.0f, 1.0f, 0.0f));
	clear(getSubregion(dst, left,	top,	0, width-left,	height-top, 1), Vec4(0.5f, 0.5f, 0.5f, 1.0f));
}